

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O1

void __thiscall
uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::add
          (HttpRouter<uWS::HttpContextData<true>::RouterData> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *methods,string *pattern,unique_function<bool_(HttpRouter<RouterData>_*)> *handler,
          uint32_t priority)

{
  pointer pcVar1;
  const_iterator cVar2;
  const_iterator __position;
  Node *parent;
  pointer pbVar3;
  ulong uVar4;
  ulong uVar5;
  int urlSegment;
  string method;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  string local_b0;
  string local_90;
  unique_function<bool_(HttpRouter<RouterData>_*)> *local_70;
  Node *local_68;
  pointer local_60;
  string *local_58;
  pointer local_50;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> local_48;
  
  pbVar3 = (methods->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (methods->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_70 = handler;
  local_58 = pattern;
  if (pbVar3 != local_60) {
    local_68 = &this->root;
    do {
      local_d0 = local_c0;
      pcVar1 = (pbVar3->_M_dataplus)._M_p;
      local_50 = pbVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar1,pcVar1 + pbVar3->_M_string_length);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_d0,local_c8 + (long)local_d0);
      parent = getNode(this,local_68,&local_b0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = (local_58->_M_dataplus)._M_p;
      (this->currentUrl)._M_len = local_58->_M_string_length;
      (this->currentUrl)._M_str = pcVar1;
      this->urlSegmentTop = -1;
      urlSegment = 0;
      while (getUrlSegment(&local_48,this,urlSegment), local_48.second != true) {
        getUrlSegment(&local_48,this,urlSegment);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,local_48.first._M_str,
                   local_48.first._M_str +
                   CONCAT44(local_48.first._M_len._4_4_,(uint)local_48.first._M_len));
        parent = getNode(this,parent,&local_90,priority == 0xd0000000);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        urlSegment = urlSegment + 1;
      }
      cVar2._M_current =
           (parent->handlers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_48.first._M_len._0_4_ =
           (uint)((ulong)((long)(this->handlers).
                                super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->handlers).
                               super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5) | priority;
      uVar5 = (long)(parent->handlers).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)cVar2._M_current >> 2;
      while (__position._M_current = cVar2._M_current, 0 < (long)uVar5) {
        uVar4 = uVar5 >> 1;
        uVar5 = ~uVar4 + uVar5;
        cVar2._M_current = __position._M_current + uVar4 + 1;
        if ((uint)local_48.first._M_len < __position._M_current[uVar4]) {
          cVar2._M_current = __position._M_current;
          uVar5 = uVar4;
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
                (&parent->handlers,__position,(value_type_conflict2 *)&local_48);
      if (local_d0 != local_c0) {
        operator_delete(local_d0,local_c0[0] + 1);
      }
      pbVar3 = local_50 + 1;
    } while (pbVar3 != local_60);
  }
  std::
  vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>,std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>>>
  ::
  emplace_back<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>>
            ((vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>,std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>>>
              *)&this->handlers,
             (function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>
              *)local_70);
  return;
}

Assistant:

void add(std::vector<std::string> methods, std::string pattern, fu2::unique_function<bool(HttpRouter *)> &&handler, uint32_t priority = MEDIUM_PRIORITY) {
        for (std::string method : methods) {
            /* Lookup method */
            Node *node = getNode(&root, method, false);
            /* Iterate over all segments */
            setUrl(pattern);
            for (int i = 0; !getUrlSegment(i).second; i++) {
                node = getNode(node, std::string(getUrlSegment(i).first), priority == HIGH_PRIORITY);
            }
            /* Insert handler in order sorted by priority (most significant 1 byte) */
            node->handlers.insert(std::upper_bound(node->handlers.begin(), node->handlers.end(), (uint32_t) (priority | handlers.size())), (uint32_t) (priority | handlers.size()));
        }

        /* Alloate this handler */
        handlers.emplace_back(std::move(handler));
    }